

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP4Reader::InitBuffer
          (BP4Reader *this,TimePoint *timeoutInstant,Seconds *pollSeconds,Seconds *timeoutSeconds)

{
  Comm *this_00;
  TransportMan *this_01;
  _func_int *p_Var1;
  BP4Deserializer *pBVar2;
  bool bVar3;
  size_t sVar4;
  uint64_t size;
  BP4Reader *this_02;
  allocator local_2bb;
  allocator local_2ba;
  allocator local_2b9;
  size_t local_2b8;
  BP4Deserializer *local_2b0;
  size_t newIdxSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  Seconds *local_298;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  newIdxSize = 0;
  local_2b0 = &this->m_BP4Deserializer;
  if (*(int *)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x10 +
              (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) == 0) {
    sVar4 = transportman::TransportMan::GetFileSize(&this->m_MDIndexFileManager,0);
    pBVar2 = local_2b0;
    if (sVar4 != 0) {
      p_Var1 = local_2b0->_vptr_BP4Deserializer[-3];
      local_2b8 = sVar4;
      local_298 = timeoutSeconds;
      std::__cxx11::string::string
                ((string *)&local_50,
                 "allocating metadata index buffer, in call to BPFileReader Open",
                 (allocator *)&local_290);
      sVar4 = local_2b8;
      adios2::format::BufferSTL::Resize
                ((BufferSTL *)(p_Var1 + 0x38 + (long)&(pBVar2->m_Minifooter).VersionTag),local_2b8,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      transportman::TransportMan::ReadFile
                (&this->m_MDIndexFileManager,
                 *(char **)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-3] + 0x80 +
                           (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),sVar4,0,0);
      local_2a0 = &(this->super_Engine).m_Name;
      size = MetadataExpectedMinFileSize(pBVar2,local_2a0,true);
      this_01 = &this->m_MDFileManager;
      do {
        this_02 = (BP4Reader *)this_01;
        sVar4 = transportman::TransportMan::GetFileSize(this_01,0);
        pBVar2 = local_2b0;
        if (size <= sVar4) {
          p_Var1 = local_2b0->_vptr_BP4Deserializer[-4];
          std::__cxx11::string::string
                    ((string *)&local_70,"allocating metadata buffer, in call to BP4Reader Open",
                     (allocator *)&local_290);
          adios2::format::BufferSTL::Resize
                    ((BufferSTL *)(&pBVar2->field_0x88 + (long)p_Var1),size,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          transportman::TransportMan::ReadFile
                    (this_01,*(char **)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 200 +
                                       (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),size,
                     0,0);
          this->m_MDFileAlreadyReadSize = size;
          newIdxSize = local_2b8;
          this->m_MDIndexFileAlreadyReadSize = local_2b8;
          goto LAB_0049a27f;
        }
        bVar3 = SleepOrQuit(this_02,timeoutInstant,pollSeconds);
      } while (bVar3);
      std::__cxx11::string::string((string *)&local_290,"Engine",&local_2b9);
      std::__cxx11::string::string((string *)&local_90,"BP4Reader",&local_2ba);
      std::__cxx11::string::string((string *)&local_b0,"InitBuffer",&local_2bb);
      std::operator+(&local_1f0,"File ",local_2a0);
      std::operator+(&local_1d0,&local_1f0,
                     " was found with an index file but md.0 has not contained enough data within the specified timeout of "
                    );
      std::__cxx11::to_string(&local_210,local_298->__r);
      std::operator+(&local_1b0,&local_1d0,&local_210);
      std::operator+(&local_190,&local_1b0," seconds. index size = ");
      std::__cxx11::to_string(&local_230,local_2b8);
      std::operator+(&local_170,&local_190,&local_230);
      std::operator+(&local_150,&local_170," metadata size = ");
      std::__cxx11::to_string(&local_250,sVar4);
      std::operator+(&local_130,&local_150,&local_250);
      std::operator+(&local_110,&local_130," expected size = ");
      std::__cxx11::to_string(&local_270,size);
      std::operator+(&local_f0,&local_110,&local_270);
      std::operator+(&local_d0,&local_f0,
                     ". One reason could be if the reader finds old data while the writer is creating the new files."
                    );
      helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_290,&local_90,&local_b0,&local_d0,-1);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_290);
    }
  }
LAB_0049a27f:
  this_00 = &(this->super_Engine).m_Comm;
  newIdxSize = helper::Comm::BroadcastValue<unsigned_long>(this_00,&newIdxSize,0);
  pBVar2 = local_2b0;
  if (newIdxSize != 0) {
    helper::Comm::BroadcastVector<char>
              (this_00,(vector<char,_std::allocator<char>_> *)
                       (&local_2b0->field_0xc8 +
                       (long)(this->m_BP4Deserializer)._vptr_BP4Deserializer[-4]),0);
    helper::Comm::BroadcastVector<char>
              (this_00,(vector<char,_std::allocator<char>_> *)
                       ((this->m_BP4Deserializer)._vptr_BP4Deserializer[-3] + 0x28 +
                       (long)&(pBVar2->m_DeferredVariablesMap)._M_t),0);
    adios2::format::BP4Deserializer::ParseMetadataIndex
              (pBVar2,(BufferSTL *)
                      ((this->m_BP4Deserializer)._vptr_BP4Deserializer[-3] + 0x38 +
                      (long)&(pBVar2->m_Minifooter).VersionTag),0,true,false);
    this->m_IdxHeaderParsed = true;
    sVar4 = adios2::format::BP4Deserializer::ParseMetadata
                      (pBVar2,(BufferSTL *)
                              (&pBVar2->field_0x88 +
                              (long)(this->m_BP4Deserializer)._vptr_BP4Deserializer[-4]),
                       &this->super_Engine,true);
    this->m_MDFileProcessedSize = sVar4;
  }
  return;
}

Assistant:

void BP4Reader::InitBuffer(const TimePoint &timeoutInstant, const Seconds &pollSeconds,
                           const Seconds &timeoutSeconds)
{
    size_t newIdxSize = 0;
    // Put all metadata in buffer
    if (m_BP4Deserializer.m_RankMPI == 0)
    {
        /* Read metadata index table into memory */
        const size_t metadataIndexFileSize = m_MDIndexFileManager.GetFileSize(0);
        if (metadataIndexFileSize > 0)
        {
            m_BP4Deserializer.m_MetadataIndex.Resize(metadataIndexFileSize,
                                                     "allocating metadata index buffer, "
                                                     "in call to BPFileReader Open");
            m_MDIndexFileManager.ReadFile(m_BP4Deserializer.m_MetadataIndex.m_Buffer.data(),
                                          metadataIndexFileSize);

            /* Read metadata file into memory but first make sure
             * it has the content that the index table refers to */
            uint64_t expectedMinFileSize =
                MetadataExpectedMinFileSize(m_BP4Deserializer, m_Name, true);
            size_t fileSize = 0;
            do
            {
                fileSize = m_MDFileManager.GetFileSize(0);
                if (fileSize >= expectedMinFileSize)
                {
                    break;
                }
            } while (SleepOrQuit(timeoutInstant, pollSeconds));

            if (fileSize >= expectedMinFileSize)
            {
                m_BP4Deserializer.m_Metadata.Resize(
                    expectedMinFileSize, "allocating metadata buffer, in call to BP4Reader Open");

                m_MDFileManager.ReadFile(m_BP4Deserializer.m_Metadata.m_Buffer.data(),
                                         expectedMinFileSize);
                m_MDFileAlreadyReadSize = expectedMinFileSize;
                m_MDIndexFileAlreadyReadSize = metadataIndexFileSize;
                newIdxSize = metadataIndexFileSize;
            }
            else
            {
                helper::Throw<std::ios_base::failure>(
                    "Engine", "BP4Reader", "InitBuffer",
                    "File " + m_Name +
                        " was found with an index file but md.0 "
                        "has not contained enough data within "
                        "the specified timeout of " +
                        std::to_string(timeoutSeconds.count()) +
                        " seconds. index size = " + std::to_string(metadataIndexFileSize) +
                        " metadata size = " + std::to_string(fileSize) +
                        " expected size = " + std::to_string(expectedMinFileSize) +
                        ". One reason could be if the reader finds old data "
                        "while "
                        "the writer is creating the new files.");
            }
        }
    }

    newIdxSize = m_Comm.BroadcastValue(newIdxSize, 0);

    if (newIdxSize > 0)
    {
        // broadcast buffer to all ranks from zero
        m_Comm.BroadcastVector(m_BP4Deserializer.m_Metadata.m_Buffer);

        // broadcast metadata index buffer to all ranks from zero
        m_Comm.BroadcastVector(m_BP4Deserializer.m_MetadataIndex.m_Buffer);

        /* Parse metadata index table */
        m_BP4Deserializer.ParseMetadataIndex(m_BP4Deserializer.m_MetadataIndex, 0, true, false);
        // now we are sure the index header has been parsed, first step parsing
        // done
        m_IdxHeaderParsed = true;

        // fills IO with Variables and Attributes
        m_MDFileProcessedSize =
            m_BP4Deserializer.ParseMetadata(m_BP4Deserializer.m_Metadata, *this, true);

        /* m_MDFileProcessedSize is the position in the buffer where processing
         * ends. The processing is controlled by the number of records in the
         * Index, which may be less than the actual entries in the metadata in a
         * streaming situation (where writer has just written metadata for step
         * K+1,...,K+L while the index contains K steps when the reader looks at
         * it).
         *
         * In ProcessMetadataForNewSteps(), we will re-read the metadata which
         * is in the buffer but has not been processed yet.
         */
    }
}